

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall Lexer::mustGetAnyOf(Lexer *this,List<Token> *toks)

{
  bool bVar1;
  Token TVar2;
  reference pTVar3;
  Token *pTVar4;
  TokenInfo *tok_00;
  String local_128;
  String local_108;
  Token *local_e8;
  Token *tokType;
  ConstIterator __end1_1;
  undefined1 local_b0 [8];
  ConstIterator __begin1_1;
  List<Token> *__range1_1;
  String toknames;
  undefined1 local_60 [4];
  Token tok;
  ConstIterator __end1;
  ConstIterator __begin1;
  List<Token> *__range1;
  List<Token> *toks_local;
  Lexer *this_local;
  
  bVar1 = next(this,Any);
  if (!bVar1) {
    error<>("unexpected EOF");
  }
  List<Token>::begin((ConstIterator *)&__end1._M_node,toks);
  List<Token>::end((ConstIterator *)local_60,toks);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)local_60);
    if (!bVar1) {
      String::String((String *)&__range1_1);
      __begin1_1._M_node = (_Map_pointer)toks;
      List<Token>::begin((ConstIterator *)local_b0,toks);
      List<Token>::end((ConstIterator *)&tokType,(List<Token> *)__begin1_1._M_node);
      while (bVar1 = std::operator!=((_Self *)local_b0,(_Self *)&tokType), bVar1) {
        pTVar3 = std::_Deque_iterator<Token,_const_Token_&,_const_Token_*>::operator*
                           ((_Deque_iterator<Token,_const_Token_&,_const_Token_*> *)local_b0);
        local_e8 = pTVar3;
        pTVar4 = List<Token>::last(toks);
        if (pTVar3 == pTVar4) {
          String::operator+=((String *)&__range1_1," or ");
        }
        else {
          bVar1 = String::isEmpty((String *)&__range1_1);
          if (!bVar1) {
            String::operator+=((String *)&__range1_1,", ");
          }
        }
        DescribeTokenType(&local_108,*local_e8);
        String::operator+=((String *)&__range1_1,&local_108);
        String::~String(&local_108);
        std::_Deque_iterator<Token,_const_Token_&,_const_Token_*>::operator++
                  ((_Deque_iterator<Token,_const_Token_&,_const_Token_*> *)local_b0);
      }
      tok_00 = token(this);
      DescribeToken(&local_128,tok_00);
      error<String,String>("expected %1, got %2",(String *)&__range1_1,&local_128);
      String::~String(&local_128);
      String::~String((String *)&__range1_1);
      return;
    }
    pTVar3 = std::_Deque_iterator<Token,_const_Token_&,_const_Token_*>::operator*
                       ((_Deque_iterator<Token,_const_Token_&,_const_Token_*> *)&__end1._M_node);
    toknames._28_4_ = *pTVar3;
    TVar2 = tokenType(this);
    if (TVar2 == toknames._28_4_) break;
    std::_Deque_iterator<Token,_const_Token_&,_const_Token_*>::operator++
              ((_Deque_iterator<Token,_const_Token_&,_const_Token_*> *)&__end1._M_node);
  }
  return;
}

Assistant:

void Lexer::mustGetAnyOf (const List<Token>& toks)
{
	if (!next())
		error ("unexpected EOF");

	for (Token tok : toks)
		if (tokenType() == tok)
			return;

	String toknames;

	for (const Token& tokType : toks)
	{
		if (&tokType == &toks.last())
			toknames += " or ";
		elif (toknames.isEmpty() == false)
			toknames += ", ";

		toknames += DescribeTokenType (tokType);
	}

	error ("expected %1, got %2", toknames, DescribeToken (token()));
}